

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall Thread::start(Thread *this,Priority priority,size_t stackSize)

{
  int iVar1;
  Log local_d0;
  Log local_c0;
  Log local_b0;
  Log local_a0 [2];
  Log local_80;
  Log local_70;
  pthread_attr_t *local_60;
  pthread_attr_t *pattr;
  pthread_attr_t attr;
  size_t stackSize_local;
  Thread *pTStack_10;
  Priority priority_local;
  Thread *this_local;
  
  local_60 = (pthread_attr_t *)0x0;
  attr._48_8_ = stackSize;
  stackSize_local._4_4_ = priority;
  pTStack_10 = this;
  if (priority == Idle) {
    initAttr(&local_60,(pthread_attr_t *)&pattr);
    iVar1 = pthread_attr_setschedpolicy((pthread_attr_t *)local_60,5);
    if (iVar1 != 0) {
      ::error();
      Log::operator<<(&local_70,(char *)&local_80);
      Log::~Log(&local_70);
      Log::~Log(&local_80);
    }
  }
  if (attr._48_8_ != 0) {
    initAttr(&local_60,(pthread_attr_t *)&pattr);
    iVar1 = pthread_attr_setstacksize((pthread_attr_t *)local_60,attr._48_8_);
    if (iVar1 != 0) {
      ::error();
      Log::operator<<(local_a0,(char *)&local_b0);
      Log::~Log(local_a0);
      Log::~Log(&local_b0);
    }
  }
  this->mRunning = true;
  iVar1 = pthread_create(&this->mThread,(pthread_attr_t *)local_60,localStart,this);
  if (iVar1 != 0) {
    ::error();
    Log::operator<<(&local_c0,(char *)&local_d0);
    Log::~Log(&local_c0);
    Log::~Log(&local_d0);
  }
  if (local_60 != (pthread_attr_t *)0x0) {
    pthread_attr_destroy((pthread_attr_t *)local_60);
  }
  return;
}

Assistant:

void Thread::start(Priority priority, size_t stackSize)
{
    pthread_attr_t attr;
    pthread_attr_t* pattr = 0;
    if (priority == Idle) {
#ifdef HAVE_SCHEDIDLE
        initAttr(&pattr, &attr);
        if (pthread_attr_setschedpolicy(pattr, SCHED_IDLE) != 0) {
            error() << "pthread_attr_setschedpolicy failed";
        }
#endif
    }
    if (stackSize > 0) {
        initAttr(&pattr, &attr);
        if (pthread_attr_setstacksize(pattr, stackSize) != 0) {
            error() << "pthread_attr_setstacksize failed";
        }
    }
    mRunning = true;
    if (pthread_create(&mThread, pattr, localStart, this) != 0) {
        error() << "pthread_create failed";
    }
    if (pattr) {
        pthread_attr_destroy(pattr);
    }
}